

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

ostream * CS248::operator<<(ostream *os,Matrix4x4 *A)

{
  double *pdVar1;
  ostream *poVar2;
  ostream *in_RDI;
  int j;
  int i;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    std::operator<<(in_RDI,"[ ");
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      poVar2 = in_RDI;
      pdVar1 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar1);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<(in_RDI,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Matrix4x4& A ) {
    for( int i = 0; i < 4; i++ )
    {
       os << "[ ";

       for( int j = 0; j < 4; j++ )
       {
          os << A(i,j) << " ";
       }

       os << "]" << std::endl;
    }

    return os;
  }